

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O0

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateSplitNDLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr___00;
  bool bVar1;
  int iVar2;
  string *psVar3;
  Tensor *this_00;
  int64_t iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  undefined1 local_f8 [8];
  string err_2;
  undefined1 local_b8 [8];
  string err_1;
  undefined1 local_90 [4];
  int rank;
  undefined1 local_70 [8];
  string err;
  SplitNDLayerParams *params;
  size_t numSplits;
  NeuralNetworkLayer *layer_local;
  NeuralNetworkSpecValidator *this_local;
  Result *_result;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar1 = Result::good(__return_storage_ptr__);
  if (bVar1) {
    Result::~Result(__return_storage_ptr__);
    validateOutputCount(__return_storage_ptr__,layer,2,-1);
    bVar1 = Result::good(__return_storage_ptr__);
    if (bVar1) {
      Result::~Result(__return_storage_ptr__);
      err.field_2._8_8_ = Specification::NeuralNetworkLayer::splitnd(layer);
      iVar2 = Specification::SplitNDLayerParams::splitsizes_size
                        ((SplitNDLayerParams *)err.field_2._8_8_);
      if (iVar2 < 1) {
        params = (SplitNDLayerParams *)
                 Specification::SplitNDLayerParams::numsplits
                           ((SplitNDLayerParams *)err.field_2._8_8_);
      }
      else {
        iVar2 = Specification::SplitNDLayerParams::splitsizes_size
                          ((SplitNDLayerParams *)err.field_2._8_8_);
        params = (SplitNDLayerParams *)(long)iVar2;
      }
      if (params == (SplitNDLayerParams *)0x0) {
        psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_90
                       ,"Either split_sizes or num_splits should be provided for \'",psVar3);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_90,"\' layer.");
        std::__cxx11::string::~string((string *)local_90);
        Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_70);
        std::__cxx11::string::~string((string *)local_70);
      }
      else {
        iVar2 = Specification::NeuralNetworkLayer::inputtensor_size(layer);
        if (0 < iVar2) {
          this_00 = Specification::NeuralNetworkLayer::inputtensor(layer,0);
          err_1.field_2._12_4_ = Specification::Tensor::rank(this_00);
          iVar4 = Specification::SplitNDLayerParams::axis((SplitNDLayerParams *)err.field_2._8_8_);
          if ((iVar4 < (int)-err_1.field_2._12_4_) ||
             (iVar4 = Specification::SplitNDLayerParams::axis
                                ((SplitNDLayerParams *)err.field_2._8_8_),
             (int)err_1.field_2._12_4_ <= iVar4)) {
            psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
            __return_storage_ptr___00 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&err_2.field_2 + 8);
            std::operator+(__return_storage_ptr___00,
                           "Value of axis must be in the range [-rank(tensor), rank(tensor)) for \'"
                           ,psVar3);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_b8,__return_storage_ptr___00,"\' layer.");
            std::__cxx11::string::~string((string *)(err_2.field_2._M_local_buf + 8));
            Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_b8);
            std::__cxx11::string::~string((string *)local_b8);
            return __return_storage_ptr__;
          }
        }
        iVar2 = Specification::NeuralNetworkLayer::output_size(layer);
        if (params == (SplitNDLayerParams *)(long)iVar2) {
          Result::Result(__return_storage_ptr__);
        }
        else {
          psVar3 = Specification::NeuralNetworkLayer::name_abi_cxx11_(layer);
          std::operator+(&local_118,"Value of num_splits should match size of output names for \'",
                         psVar3);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_f8,&local_118,"\' layer.");
          std::__cxx11::string::~string((string *)&local_118);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,(string *)local_f8);
          std::__cxx11::string::~string((string *)local_f8);
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateSplitNDLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 2, -1));

    size_t numSplits = 0;
    const auto& params = layer.splitnd();

    if (params.splitsizes_size() > 0) {
        numSplits = static_cast<size_t>(params.splitsizes_size());
    } else {
        numSplits = static_cast<size_t>(params.numsplits());
    }
    if (numSplits == 0) {
        const std::string err = "Either split_sizes or num_splits should be provided for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }
    if (layer.inputtensor_size() > 0) {
        const int rank = static_cast<int>(layer.inputtensor(0).rank());
        if (params.axis() < -rank || params.axis() >= rank) {
            const std::string err = "Value of axis must be in the range [-rank(tensor), rank(tensor)) for '" + layer.name() + "' layer.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
    }
    if (numSplits != static_cast<size_t>(layer.output_size())) {
        const std::string err = "Value of num_splits should match size of output names for '" + layer.name() + "' layer.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    return Result();
}